

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O2

ProStringList * __thiscall
NmakeMakefileGenerator::extraSubTargetDependencies
          (ProStringList *__return_storage_ptr__,NmakeMakefileGenerator *this)

{
  long in_FS_OFFSET;
  ProString PStack_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ProString::ProString(&PStack_48,"$(MAKEFILE)");
  ProStringList::ProStringList(__return_storage_ptr__,&PStack_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList NmakeMakefileGenerator::extraSubTargetDependencies()
{
    return { "$(MAKEFILE)" };
}